

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O3

int StateLenMoveHistory(pyhanabi_state_t *state)

{
  void *pvVar1;
  
  if (state == (pyhanabi_state_t *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x1fb,"int StateLenMoveHistory(pyhanabi_state_t *)");
  }
  pvVar1 = state->state;
  if (pvVar1 != (void *)0x0) {
    return (int)((ulong)(*(long *)((long)pvVar1 + 0x60) - *(long *)((long)pvVar1 + 0x58)) >> 4);
  }
  __assert_fail("state->state != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x1fc,"int StateLenMoveHistory(pyhanabi_state_t *)");
}

Assistant:

int StateLenMoveHistory(pyhanabi_state_t* state) {
  REQUIRE(state != nullptr);
  REQUIRE(state->state != nullptr);
  return reinterpret_cast<const hanabi_learning_env::HanabiState*>(state->state)
      ->MoveHistory()
      .size();
}